

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O1

int FmsComponentAddPartEntities
              (FmsComponent comp,FmsInt part_id,FmsEntityType type,FmsIntType id_store_type,
              FmsIntType ent_id_type,FmsIntType orient_type,FmsOrientation *inv_orient_map,
              void *ents,void *ent_orients,FmsInt num_ents)

{
  ulong uVar1;
  size_t sVar2;
  ulong uVar3;
  void *__ptr;
  FmsOrientation *__ptr_00;
  ulong __size;
  _FmsPart_private *p_Var4;
  
  if (comp == (FmsComponent)0x0) {
    return 1;
  }
  if (comp->num_parts <= part_id) {
    return 2;
  }
  if (FMS_PYRAMID < type) {
    return 3;
  }
  if ((comp->dim != 0x7f) && (comp->dim != FmsEntityDim[type])) {
    return 3;
  }
  if (FMS_INT_TYPE < id_store_type) {
    return 4;
  }
  if (FMS_INT_TYPE < ent_id_type) {
    return 5;
  }
  if (FMS_INT_TYPE < orient_type) {
    return 6;
  }
  p_Var4 = comp->parts + part_id;
  uVar1 = p_Var4->num_entities[type];
  __ptr = p_Var4->entities_ids[type];
  __ptr_00 = p_Var4->orientations[type];
  if (uVar1 == 0) {
    if ((ents == (void *)0x0) && (p_Var4->domain->num_entities[type] != num_ents)) {
      return 0xc;
    }
  }
  else {
    if (__ptr == (void *)0x0) {
      return 7;
    }
    if (__ptr_00 == (FmsOrientation *)0x0) {
      return 8;
    }
    if (ents == (void *)0x0) {
      return 9;
    }
    if (ent_orients == (void *)0x0) {
      return 10;
    }
    if (p_Var4->entities_ids_type[type] != id_store_type) {
      return 0xb;
    }
  }
  if (num_ents != 0) {
    sVar2 = FmsIntTypeSize[id_store_type];
    uVar3 = 1;
    do {
      __size = uVar3;
      uVar3 = __size * 2;
    } while (__size < uVar1 + num_ents);
    if (ents != (void *)0x0) {
      if (uVar1 <= __size >> 1) {
        __ptr = realloc(__ptr,__size * sVar2);
        if (__ptr == (void *)0x0) {
          return 0xd;
        }
        p_Var4->entities_ids[type] = __ptr;
      }
      FmsIntConvertCopy(ent_id_type,ents,id_store_type,(void *)(sVar2 * uVar1 + (long)__ptr),
                        num_ents);
    }
    if (ent_orients != (void *)0x0) {
      if (uVar1 <= __size >> 1) {
        __ptr_00 = (FmsOrientation *)realloc(__ptr_00,__size);
        if (__ptr_00 == (FmsOrientation *)0x0) {
          return 0xd;
        }
        p_Var4->orientations[type] = __ptr_00;
      }
      if (inv_orient_map == (FmsOrientation *)0x0) {
        FmsIntConvertCopy(orient_type,ent_orients,FMS_ORIENTATION_INT_TYPE,__ptr_00 + uVar1,num_ents
                         );
      }
      else {
        FmsIntMapCopy(orient_type,ent_orients,(FmsIntType)(__ptr_00 + uVar1),inv_orient_map,
                      (void *)num_ents,(FmsInt)ent_orients);
      }
    }
  }
  p_Var4->num_entities[type] = uVar1 + num_ents;
  if (uVar1 == 0) {
    p_Var4->entities_ids_type[type] = id_store_type;
  }
  if (comp->dim == 0x7f) {
    comp->dim = FmsEntityDim[type];
  }
  comp->num_main_entities = comp->num_main_entities + num_ents;
  return 0;
}

Assistant:

int FmsComponentAddPartEntities(FmsComponent comp, FmsInt part_id,
                                FmsEntityType type, FmsIntType id_store_type,
                                FmsIntType ent_id_type, FmsIntType orient_type,
                                const FmsOrientation *inv_orient_map,
                                const void *ents, const void *ent_orients,
                                FmsInt num_ents) {
  if (!comp) { E_RETURN(1); }
  if (part_id >= comp->num_parts) { E_RETURN(2); }
  if (type >= FMS_NUM_ENTITY_TYPES) { E_RETURN(3); }
  if (comp->dim != FMS_INVALID_DIM && comp->dim != FmsEntityDim[type]) {
    E_RETURN(3);
  }
  if (id_store_type >= FMS_NUM_INT_TYPES) { E_RETURN(4); }
  if (ent_id_type >= FMS_NUM_INT_TYPES) { E_RETURN(5); }
  if (orient_type >= FMS_NUM_INT_TYPES) { E_RETURN(6); }
  struct _FmsPart_private *part = comp->parts + part_id;
  const FmsInt num_entities = part->num_entities[type];
  void *entities_ids = part->entities_ids[type];
  FmsOrientation *orientations = part->orientations[type];
  if (num_entities != 0) {
    if (entities_ids == NULL) { E_RETURN(7); }
    if (orientations == NULL) { E_RETURN(8); }
    if (ents == NULL) { E_RETURN(9); }
    if (ent_orients == NULL) { E_RETURN(10); }
    if (part->entities_ids_type[type] != id_store_type) { E_RETURN(11); }
  } else if (ents == NULL) {
    if (num_ents != part->domain->num_entities[type]) { E_RETURN(12); }
  }
  const size_t sizeof_ent_ids = FmsIntTypeSize[id_store_type];
  if (num_ents != 0) {
    const FmsInt nc = NextPow2(num_entities + num_ents);
    if (ents != NULL) {
      if (num_entities <= nc/2) {
        entities_ids = realloc(entities_ids, nc*sizeof_ent_ids);
        if (entities_ids == NULL) { E_RETURN(13); }
        part->entities_ids[type] = entities_ids;
      }
      FmsIntConvertCopy(ent_id_type, ents, id_store_type,
                        (char*)entities_ids + num_entities*sizeof_ent_ids,
                        num_ents);
    } else {
      // part->entities_ids[type] is already NULL since num_entities is 0
    }
    if (ent_orients != NULL) {
      if (num_entities <= nc/2) {
        orientations = realloc(orientations, nc*sizeof(FmsOrientation));
        if (orientations == NULL) { E_RETURN(13); }
        part->orientations[type] = orientations;
      }
      if (inv_orient_map != NULL) {
        FmsIntMapCopy(orient_type, ent_orients, FMS_ORIENTATION_INT_TYPE,
                      orientations + num_entities, inv_orient_map, num_ents);
      } else {
        FmsIntConvertCopy(orient_type, ent_orients, FMS_ORIENTATION_INT_TYPE,
                          orientations + num_entities, num_ents);
      }
    } else {
      // part->orientations[type] is already NULL since num_entities is 0
    }
  }
  // Update the part
  part->num_entities[type] = num_entities + num_ents;
  if (num_entities == 0) {
    part->entities_ids_type[type] = id_store_type;
  }
  // Update the component
  if (comp->dim == FMS_INVALID_DIM) {
    comp->dim = FmsEntityDim[type];
  }
  comp->num_main_entities += num_ents;
  return 0;
}